

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall iDynTree::Model::isLinkNameUsed(Model *this,string *linkName)

{
  __type _Var1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar2 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
    uVar4 = uVar4 + 1;
    if (uVar2 <= uVar4) break;
    _Var1 = std::operator==(linkName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&(((this->linkNames).
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar3));
    lVar3 = lVar3 + 0x20;
  } while (!_Var1);
  return uVar4 < uVar2;
}

Assistant:

bool Model::isLinkNameUsed(const std::string linkName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( linkName == linkNames[i] )
        {
            return true;
        }
    }

    return false;
}